

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPResponse.cpp
# Opt level: O0

void __thiscall
HTTPResponse::HTTPResponse
          (HTTPResponse *this,int statusCode,string *status,string *contentType,string *content)

{
  undefined1 uVar1;
  ostream *poVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  undefined1 *puVar8;
  string *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  ulong in_R8;
  int i_1;
  int i;
  string header;
  stringstream ss;
  undefined8 in_stack_fffffffffffffda8;
  int iVar9;
  int local_228;
  int local_224;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  stringstream local_1c0 [16];
  ostream local_1b0 [392];
  ulong local_28;
  string *local_20;
  string *local_18;
  
  iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_18 = (string *)CONCAT71(in_register_00000011,in_DL);
  *in_RDI = in_ESI;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::__cxx11::string::string((string *)(in_RDI + 2),local_18);
  std::__cxx11::string::string((string *)(in_RDI + 10),local_20);
  in_RDI[0x14] = 0;
  std::__cxx11::stringstream::stringstream(local_1c0);
  std::operator<<(local_1b0,"HTTP/1.1 ");
  std::__cxx11::to_string(iVar9);
  poVar2 = std::operator<<(local_1b0,local_1e0);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string(local_1e0);
  poVar2 = std::operator<<(local_1b0,local_18);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_1b0,"Content-Type: ");
  poVar2 = std::operator<<(poVar2,local_20);
  std::operator<<(poVar2,"\n");
  poVar3 = std::operator<<(local_1b0,"Content-Length: ");
  std::__cxx11::string::size();
  std::__cxx11::to_string((unsigned_long)poVar2);
  poVar2 = std::operator<<(poVar3,local_200);
  std::operator<<(poVar2,"\n\n");
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::str();
  lVar4 = std::__cxx11::string::size();
  lVar5 = std::__cxx11::string::size();
  pvVar6 = operator_new__(lVar4 + 4 + lVar5);
  *(void **)(in_RDI + 0x12) = pvVar6;
  local_224 = 0;
  while( true ) {
    uVar7 = std::__cxx11::string::size();
    if (uVar7 <= (ulong)(long)local_224) break;
    puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_220);
    uVar1 = *puVar8;
    iVar9 = in_RDI[0x14];
    in_RDI[0x14] = iVar9 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x12) + (long)iVar9) = uVar1;
    local_224 = local_224 + 1;
  }
  local_228 = 0;
  while( true ) {
    uVar7 = std::__cxx11::string::size();
    if (uVar7 <= (ulong)(long)local_228) break;
    puVar8 = (undefined1 *)std::__cxx11::string::operator[](local_28);
    uVar1 = *puVar8;
    iVar9 = in_RDI[0x14];
    in_RDI[0x14] = iVar9 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x12) + (long)iVar9) = uVar1;
    local_228 = local_228 + 1;
  }
  std::__cxx11::string::~string(local_220);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

HTTPResponse::HTTPResponse(int statusCode, const std::string& status, const std::string& contentType, const std::string& content)
    : statusCode(statusCode), status(status), contentType(contentType)
{
    responseSize = 0;

    std::stringstream ss;
    ss << "HTTP/1.1 ";
    ss << std::to_string(statusCode) << " ";
    ss << status << "\n";
    ss << "Content-Type: " << contentType << "\n";
    ss << "Content-Length: " << std::to_string(content.size()) << "\n\n";

    std::string header = ss.str();
    this->response = new char[header.size() + content.size() + 4];
    for (int i = 0; i < header.size(); i++)
        response[responseSize++] = header[i];
    for (int i = 0; i < content.size(); i++)
        response[responseSize++] = content[i];
}